

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA.cpp
# Opt level: O0

void InitializeOutput(Arguments *args,DecPOMDPDiscreteInterface *decpomdp,QFunctionJAOHInterface *q,
                     bool GMAAusesBGIPSolver,string *filename,string *timingsFilename,
                     string *jpolFilename,ofstream *of,ofstream *of_jpol)

{
  long *plVar1;
  byte bVar2;
  int iVar3;
  ostream *poVar4;
  char *__file;
  int *piVar5;
  undefined8 uVar6;
  undefined8 *puVar7;
  byte in_CL;
  long *in_RDX;
  long *in_RSI;
  int *in_RDI;
  string *in_R8;
  string *in_R9;
  string *in_stack_00000008;
  long *in_stack_00000010;
  long *in_stack_00000018;
  bool fileExists;
  stat sb;
  stringstream ss;
  E *e;
  char *in_stack_fffffffffffffaa0;
  string *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaa8;
  allocator<char> *in_stack_fffffffffffffab0;
  char *in_stack_fffffffffffffab8;
  undefined7 in_stack_fffffffffffffac0;
  undefined1 in_stack_fffffffffffffac7;
  string local_3f8 [32];
  string local_3d8 [32];
  string local_3b8 [39];
  byte local_391;
  stat local_390;
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [8];
  undefined1 auStack_2b8 [24];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [39];
  allocator<char> local_239;
  MultiAgentDecisionProcessInterface local_238 [32];
  string local_218 [32];
  stringstream local_1f8 [16];
  ostream local_1e8 [407];
  allocator<char> local_51;
  string local_50 [32];
  string *local_30;
  string *local_28;
  byte local_19;
  long *local_18;
  long *local_10;
  int *local_8;
  
  local_19 = in_CL & 1;
  if (in_RDI[0x12] == 0) {
    local_30 = in_R9;
    local_28 = in_R8;
    local_18 = in_RDX;
    local_10 = in_RSI;
    local_8 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0),
               in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
    directories::MADPCreateResultsDir
              (local_50,(MultiAgentDecisionProcessInterface *)
                        ((long)local_10 + *(long *)(*local_10 + -0x40)));
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator(&local_51);
    std::__cxx11::stringstream::stringstream(local_1f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0),
               in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
    directories::MADPGetResultsFilename
              (local_218,local_238,(Arguments *)((long)local_10 + *(long *)(*local_10 + -0x40)));
    poVar4 = std::operator<<(local_1e8,local_218);
    GMAAtype::SoftPrint_abi_cxx11_((GMAA_t)local_260);
    poVar4 = std::operator<<(poVar4,local_260);
    poVar4 = std::operator<<(poVar4,"_");
    (**(code **)(*(long *)((long)local_18 + *(long *)(*local_18 + -0x60)) + 0x48))
              (local_280,(long)local_18 + *(long *)(*local_18 + -0x60));
    poVar4 = std::operator<<(poVar4,local_280);
    poVar4 = std::operator<<(poVar4,"_h");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_8[0x1e]);
    poVar4 = std::operator<<(poVar4,"_restarts");
    std::ostream::operator<<(poVar4,local_8[0x20]);
    std::__cxx11::string::~string(local_280);
    std::__cxx11::string::~string(local_260);
    std::__cxx11::string::~string(local_218);
    std::__cxx11::string::~string((string *)local_238);
    std::allocator<char>::~allocator(&local_239);
    if (local_8[0x32] != 0) {
      std::operator<<(local_1e8,"_Cluster");
      BayesianGameWithClusterInfo::SoftPrint_abi_cxx11_((BGClusterAlgorithm)local_2a0);
      std::operator<<(local_1e8,local_2a0);
      std::__cxx11::string::~string(local_2a0);
      if (local_8[0x33] != 0) {
        poVar4 = std::operator<<(local_1e8,"_tJB");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(double *)(local_8 + 0x34));
        poVar4 = std::operator<<(poVar4,"_tPjaoh");
        std::ostream::operator<<(poVar4,*(double *)(local_8 + 0x36));
      }
    }
    if ((local_8[0x28] != 0) && (local_8[0x28] == 1)) {
      poVar4 = std::operator<<(local_1e8,"_k");
      std::ostream::operator<<(poVar4,local_8[0x29]);
    }
    if ((*(byte *)((long)local_8 + 0x65) & 1) == 0) {
      std::operator<<(local_1e8,"_NoCache");
    }
    else {
      std::operator<<(local_1e8,"_CacheFM");
    }
    if ((local_19 & 1) != 0) {
      poVar4 = std::operator<<(local_1e8,"_");
      BGIP_SolverType::SoftPrint_abi_cxx11_((int)auStack_2b8 - Random);
      std::operator<<(poVar4,local_2c0);
      std::__cxx11::string::~string(local_2c0);
      switch(local_8[0x24]) {
      case 0:
      case 5:
        break;
      case 1:
        poVar4 = std::operator<<(local_1e8,"_AM_restarts");
        std::ostream::operator<<(poVar4,local_8[0x39]);
        break;
      case 2:
        poVar4 = std::operator<<(local_1e8,"_CEr");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(ulong *)(local_8 + 0x60));
        poVar4 = std::operator<<(poVar4,"_i");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(ulong *)(local_8 + 0x62));
        poVar4 = std::operator<<(poVar4,"_s");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(ulong *)(local_8 + 100));
        poVar4 = std::operator<<(poVar4,"_sfu");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(ulong *)(local_8 + 0x66));
        poVar4 = std::operator<<(poVar4,"_a");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(double *)(local_8 + 0x6a));
        poVar4 = std::operator<<(poVar4,"_ht");
        std::ostream::operator<<(poVar4,(bool)(*(byte *)(local_8 + 0x68) & 1));
        break;
      case 3:
        break;
      case 4:
        poVar4 = std::operator<<(local_1e8,"_ka");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(bool)(*(byte *)(local_8 + 0x83) & 1));
        poVar4 = std::operator<<(poVar4,"_JTO");
        BGIP_BnB::SoftPrint_abi_cxx11_((BnB_JointTypeOrdering)local_2e0);
        poVar4 = std::operator<<(poVar4,local_2e0);
        poVar4 = std::operator<<(poVar4,"_CCI");
        std::ostream::operator<<(poVar4,(bool)(*(byte *)((long)local_8 + 0x20d) & 1));
        std::__cxx11::string::~string(local_2e0);
        break;
      case 6:
        break;
      case 7:
        break;
      case 8:
        std::operator<<(local_1e8,"_Random");
      }
    }
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=(local_28,local_300);
    std::__cxx11::string::~string(local_300);
    if (local_8[0x18] != 0) {
      local_391 = 1;
      __file = (char *)std::__cxx11::string::c_str();
      iVar3 = stat(__file,&local_390);
      if (iVar3 == -1) {
        piVar5 = __errno_location();
        if (*piVar5 != 2) {
          perror("stat");
          exit(0);
        }
        local_391 = 0;
      }
      if (((local_390.st_mode & 0xf000) == 0x8000) && (local_390.st_size == 0)) {
        local_391 = 0;
      }
      if ((local_391 & 1) != 0) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Results file ");
        poVar4 = std::operator<<(poVar4,local_28);
        poVar4 = std::operator<<(poVar4," already exists, not recomputing it.");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        exit(0);
      }
    }
    if (local_8[0x12] == 0) {
      uVar6 = std::__cxx11::string::c_str();
      std::ofstream::open(in_stack_00000010,uVar6,0x10);
      bVar2 = std::ios::operator!((ios *)((long)in_stack_00000010 +
                                         *(long *)(*in_stack_00000010 + -0x18)));
      if ((bVar2 & 1) != 0) {
        poVar4 = std::operator<<((ostream *)&std::cout,"GMAA: could not open ");
        poVar4 = std::operator<<(poVar4,local_28);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        in_stack_fffffffffffffaa8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::operator<<((ostream *)&std::cout,"Results will not be stored to disk.");
        std::ostream::operator<<
                  ((ostream *)in_stack_fffffffffffffaa8,std::endl<char,std::char_traits<char>>);
        local_8[0x12] = 1;
      }
      std::operator+(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
      this = local_3b8;
      std::__cxx11::string::operator=(local_30,this);
      std::__cxx11::string::~string(this);
      std::operator+(in_stack_fffffffffffffaa8,(char *)this);
      std::__cxx11::string::operator=(in_stack_00000008,local_3d8);
      std::__cxx11::string::~string(local_3d8);
      plVar1 = in_stack_00000018;
      if (local_8[0x12] == 0) {
        uVar6 = std::__cxx11::string::c_str();
        std::ofstream::open(plVar1,uVar6,0x10);
        bVar2 = std::ios::operator!((ios *)((long)in_stack_00000018 +
                                           *(long *)(*in_stack_00000018 + -0x18)));
        if ((bVar2 & 1) != 0) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar7 = "Could not open jpol file";
          __cxa_throw(puVar7,&char_const*::typeinfo,0);
        }
      }
      if (-1 < *local_8) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Computing ");
        std::__cxx11::stringstream::str();
        poVar4 = std::operator<<(poVar4,local_3f8);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_3f8);
      }
    }
    std::__cxx11::stringstream::~stringstream(local_1f8);
  }
  return;
}

Assistant:

void InitializeOutput(ArgumentHandlers::Arguments &args,
                      DecPOMDPDiscreteInterface* decpomdp,
                      QFunctionJAOHInterface *q,
                      bool GMAAusesBGIPSolver,
                      string &filename,
                      string &timingsFilename,
                      string &jpolFilename,
                      ofstream &of,
                      ofstream &of_jpol)
{
    if(!args.dryrun)
    {
        // Create results dir if it doesn't exist already
        try {
        directories::MADPCreateResultsDir("GMAA",*decpomdp);
        } catch(E& e)
        {
            e.Print();
            cout << "Results will not be stored to disk." << endl;
            args.dryrun=true;
        }

        stringstream ss;
        ss  << directories::MADPGetResultsFilename("GMAA",*decpomdp,args)
            << SoftPrint(args.gmaa)
            << "_" << q->SoftPrintBrief() << "_h" << args.horizon
            << "_restarts"<< args.nrRestarts;

        //check the method specific arguments 
        //and add them to file name
        if(args.useBGclustering)
        {
            ss << "_Cluster";
            ss  << BayesianGameWithClusterInfo::SoftPrint(
                        static_cast<BayesianGameWithClusterInfo::BGClusterAlgorithm>(args.BGClusterAlgorithm)
                    );
            if(args.BGClusterAlgorithm != BayesianGameWithClusterInfo::Lossless)
                ss << "_tJB" << args.thresholdJB << "_tPjaoh" << args.thresholdPjaoh;
        }
        switch(args.gmaa)
        {
        case MAAstar:
        case MAAstarClassic:
        case FSPC:
            break;
        case kGMAA: 
            ss << "_k" << args.k;
            break;
        }
        if(args.cache_flat_models)
            ss << "_CacheFM";
        else
            ss << "_NoCache";
        if(GMAAusesBGIPSolver)
        {
            ss << "_" << SoftPrint(args.bgsolver);
            // if not, we don't want to add these parameters to the
            // filename as they will not be used
            switch(args.bgsolver)
            {
            case BFS:
            case BFSNonInc:
                // BFS has no parameters
                break;
            case AM:
                ss << "_AM_restarts"<< args.nrAMRestarts;
                break;
            case CE:
                ss  << "_CEr" << args.nrCERestarts 
                    << "_i" << args.nrCEIterations
                    << "_s" << args.nrCESamples 
                    << "_sfu" << args.nrCESamplesForUpdate
                    << "_a" << args.CE_alpha 
                    << "_ht" << args.CE_use_hard_threshold;
                break;
            case MaxPlus:
                break;
            case BnB:
                ss << "_ka" << args.BnB_keepAll
                   << "_JTO" << SoftPrint(args.BnBJointTypeOrdering)
                   << "_CCI" << args.BnB_consistentCompleteInformationHeur;
                break;
            case CGBG_MaxPlus:
                break;
            case NDP:
                break;    
            case Random:
                ss << "_Random";
                break;
            }
        }

        filename=ss.str();

        if(args.noReCompute)
        {
            struct stat sb;
            bool fileExists=true;

            if (stat(filename.c_str(), &sb) == -1) {
                if(errno==ENOENT)
                    fileExists=false;
                else
                {
                    perror("stat");
                    exit(EXIT_SUCCESS);
                }
            }
            
            if(S_ISREG(sb.st_mode) &&
               sb.st_size==0)
                fileExists=false;
            
            if(fileExists)
            {
                cout << "Results file " << filename
                     << " already exists, not recomputing it." << endl;
                exit(0);
            }
        }

        if(!args.dryrun)
        {
            of.open(filename.c_str());
            if(!of)
            {
                cout << "GMAA: could not open " << filename << endl;
                cout << "Results will not be stored to disk." << endl;
                args.dryrun=true;
            }
            timingsFilename=filename + "_Timings";
            jpolFilename=filename + "_JPol";
            if(!args.dryrun)
            {
                of_jpol.open(jpolFilename.c_str());
                if(!of_jpol)
                    throw("Could not open jpol file");
            }
            if(args.verbose >= 0)
                cout << "Computing " << ss.str() << endl;
        }
    }
}